

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

void henson_load_double(char *name,double *x)

{
  double *pdVar1;
  double *in_RSI;
  char *in_RDI;
  allocator local_71;
  string local_70 [16];
  string *in_stack_ffffffffffffffa0;
  NameMap *in_stack_ffffffffffffffa8;
  
  if (namemap != (NameMap *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,in_RDI,&local_71);
    henson::NameMap::get(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    pdVar1 = mpark::
             get<double,int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>
                       ((variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x193f44);
    *in_RSI = *pdVar1;
    mpark::
    variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x193f68);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return;
}

Assistant:

void
henson_load_double(const char* name, double* x)
{
    if (!namemap) return;
    *x = henson::get<double>(namemap->get(name));
}